

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool operator<(ON_String *lhs,ON_String *rhs)

{
  int iVar1;
  int element_count2;
  char *string1;
  char *string2;
  
  string1 = ON_String::operator_cast_to_char_(lhs);
  iVar1 = ON_String::Length(lhs);
  string2 = ON_String::operator_cast_to_char_(rhs);
  element_count2 = ON_String::Length(rhs);
  iVar1 = ON_StringCompareOrdinalUTF8(string1,iVar1,string2,element_count2,false);
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool operator<( const ON_String& lhs, const ON_String& rhs )
{
  const int rc = ON_String::CompareOrdinal(
    static_cast<const char*>(lhs),
    lhs.Length(),
    static_cast<const char*>(rhs),
    rhs.Length(),
    false
    );
  return (rc < 0);
}